

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O0

void __thiscall tcu::Matrix<tcu::Interval,_2,_2>::Matrix(Matrix<tcu::Interval,_2,_2> *this)

{
  Interval *pIVar1;
  Interval local_30;
  int local_18;
  int local_14;
  int col;
  int row;
  Matrix<tcu::Interval,_2,_2> *this_local;
  
  _col = this;
  Vector<tcu::Vector<tcu::Interval,_2>,_2>::Vector(&this->m_data);
  for (local_14 = 0; local_14 < 2; local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < 2; local_18 = local_18 + 1) {
      if (local_14 == local_18) {
        Interval::Interval(&local_30,1.0);
      }
      else {
        Interval::Interval(&local_30,0.0);
      }
      pIVar1 = operator()(this,local_14,local_18);
      pIVar1->m_hasNaN = local_30.m_hasNaN;
      *(undefined7 *)&pIVar1->field_0x1 = local_30._1_7_;
      pIVar1->m_lo = local_30.m_lo;
      pIVar1->m_hi = local_30.m_hi;
    }
  }
  return;
}

Assistant:

Matrix<T, Rows, Cols>::Matrix (void)
{
	for (int row = 0; row < Rows; row++)
		for (int col = 0; col < Cols; col++)
			(*this)(row, col) = (row == col) ? T(1) : T(0);
}